

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

void btreeblk_init(btreeblk_handle *handle,filemgr *file,uint32_t nodesize)

{
  void *pvVar1;
  uint in_EDX;
  undefined8 in_RSI;
  uint *in_RDI;
  uint32_t _nodesize;
  uint32_t i;
  uint local_1c;
  uint local_18;
  
  *(undefined8 *)(in_RDI + 0xe) = in_RSI;
  *in_RDI = in_EDX;
  *(short *)(in_RDI + 1) = (short)(*(uint *)(*(long *)(in_RDI + 0xe) + 0x10) / *in_RDI);
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  list_init((list *)(in_RDI + 6));
  list_init((list *)(in_RDI + 10));
  list_init((list *)(in_RDI + 0x12));
  local_18 = 0;
  for (local_1c = 0x80; local_1c < in_EDX && local_18 < 5; local_1c = local_1c << 1) {
    local_18 = local_18 + 1;
  }
  in_RDI[0x16] = local_18;
  if (in_RDI[0x16] == 0) {
    in_RDI[0x18] = 0;
    in_RDI[0x19] = 0;
  }
  else {
    pvVar1 = malloc((ulong)in_RDI[0x16] * 0x18);
    *(void **)(in_RDI + 0x18) = pvVar1;
    local_1c = 0x80;
    for (local_18 = 0; local_18 < in_RDI[0x16]; local_18 = local_18 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0x18) + (ulong)local_18 * 0x18) = 0xffffffffffffffff;
      *(uint *)(*(long *)(in_RDI + 0x18) + (ulong)local_18 * 0x18 + 8) = local_1c;
      *(short *)(*(long *)(in_RDI + 0x18) + (ulong)local_18 * 0x18 + 0xc) =
           (short)(in_EDX / local_1c);
      pvVar1 = malloc((ulong)*(ushort *)(*(long *)(in_RDI + 0x18) + (ulong)local_18 * 0x18 + 0xc));
      *(void **)(*(long *)(in_RDI + 0x18) + (ulong)local_18 * 0x18 + 0x10) = pvVar1;
      memset(*(void **)(*(long *)(in_RDI + 0x18) + (ulong)local_18 * 0x18 + 0x10),0,
             (ulong)*(ushort *)(*(long *)(in_RDI + 0x18) + (ulong)local_18 * 0x18 + 0xc));
      local_1c = local_1c << 1;
    }
  }
  return;
}

Assistant:

void btreeblk_init(struct btreeblk_handle *handle, struct filemgr *file,
                   uint32_t nodesize)
{
    uint32_t i;
    uint32_t _nodesize;

    handle->file = file;
    handle->nodesize = nodesize;
    handle->nnodeperblock = handle->file->blocksize / handle->nodesize;
    handle->nlivenodes = 0;
    handle->ndeltanodes = 0;
    handle->dirty_update = NULL;
    handle->dirty_update_writer = NULL;

    list_init(&handle->alc_list);
    list_init(&handle->read_list);

#ifdef __BTREEBLK_BLOCKPOOL
    list_init(&handle->blockpool);
#endif

    // compute # subblock sets
    _nodesize = BTREEBLK_MIN_SUBBLOCK;
    for (i=0; (_nodesize < nodesize && i<5); ++i){
        _nodesize = _nodesize << 1;
    }
    handle->nsb = i;
    if (handle->nsb) {
        handle->sb = (struct btreeblk_subblocks*)
                     malloc(sizeof(struct btreeblk_subblocks) * handle->nsb);
        // initialize each subblock set
        _nodesize = BTREEBLK_MIN_SUBBLOCK;
        for (i=0;i<handle->nsb;++i){
            handle->sb[i].bid = BLK_NOT_FOUND;
            handle->sb[i].sb_size = _nodesize;
            handle->sb[i].nblocks = nodesize / _nodesize;
            handle->sb[i].bitmap = (uint8_t*)malloc(handle->sb[i].nblocks);
            memset(handle->sb[i].bitmap, 0, handle->sb[i].nblocks);
            _nodesize = _nodesize << 1;
        }
    } else {
        handle->sb = NULL;
    }
}